

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O1

void __thiscall libtorrent::file_renamed_alert::~file_renamed_alert(file_renamed_alert *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__torrent_alert_004ebb90;
  p_Var2 = (this->super_torrent_alert).handle.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

struct TORRENT_EXPORT file_renamed_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT file_renamed_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, string_view n, string_view old, file_index_t idx);

		TORRENT_DEFINE_ALERT_PRIO(file_renamed_alert, 7, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::storage;
		std::string message() const override;

		// returns the new and previous file name, respectively.
		char const* new_name() const;
		char const* old_name() const;

		// refers to the index of the file that was renamed,
		file_index_t const index;
	private:
		aux::allocation_slot m_name_idx;
		aux::allocation_slot m_old_name_idx;
#if TORRENT_ABI_VERSION == 1

#include "libtorrent/aux_/disable_warnings_push.hpp"

	public:
		TORRENT_DEPRECATED std::string name;

#include "libtorrent/aux_/disable_warnings_pop.hpp"

#endif
	}